

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_io.c
# Opt level: O0

ssize_t kvtree_read_attempt(char *file,int fd,void *buf,size_t size)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  uint *puVar5;
  char *pcVar6;
  int local_3c;
  int rc;
  int retries;
  ssize_t n;
  size_t size_local;
  void *buf_local;
  int fd_local;
  char *file_local;
  
  _rc = 0;
  local_3c = 10;
  while( true ) {
    while( true ) {
      if (size <= _rc) {
        return _rc;
      }
      sVar3 = read(fd,(void *)((long)buf + _rc),size - _rc);
      iVar2 = (int)sVar3;
      if (iVar2 < 1) break;
      _rc = _rc + (long)iVar2;
    }
    if (iVar2 == 0) break;
    piVar4 = __errno_location();
    if ((*piVar4 != 4) && (piVar4 = __errno_location(), *piVar4 != 0xb)) {
      local_3c = local_3c + -1;
      if (local_3c == 0) {
        puVar5 = (uint *)__errno_location();
        uVar1 = *puVar5;
        piVar4 = __errno_location();
        pcVar6 = strerror(*piVar4);
        kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                   ,0x11f);
        return -1;
      }
      puVar5 = (uint *)__errno_location();
      uVar1 = *puVar5;
      piVar4 = __errno_location();
      pcVar6 = strerror(*piVar4);
      kvtree_err("Error reading file %s errno=%d %s @ %s:%d",file,(ulong)uVar1,pcVar6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_io.c"
                 ,0x11a);
    }
  }
  return _rc;
}

Assistant:

ssize_t kvtree_read_attempt(const char* file, int fd, void* buf, size_t size)
{
  ssize_t n = 0;
  int retries = 10;
  while (n < size)
  {
    int rc = read(fd, (char*) buf + n, size - n);
    if (rc  > 0) {
      n += rc;
    } else if (rc == 0) {
      /* EOF */
      return n;
    } else { /* (rc < 0) */
      /* got an error, check whether it was serious */
      if (errno == EINTR || errno == EAGAIN) {
        continue;
      }

      /* something worth printing an error about */
      retries--;
      if (retries) {
        /* print an error and try again */
        kvtree_err("Error reading file %s errno=%d %s @ %s:%d",
          file, errno, strerror(errno), __FILE__, __LINE__
        );
      } else {
        /* too many failed retries, give up */
        kvtree_err("Giving up read on file %s errno=%d %s @ %s:%d",
	  file, errno, strerror(errno), __FILE__, __LINE__
        );
        return -1;
      }
    }
  }
  return n;
}